

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorPicker::mouseMoveEvent(QColorPicker *this,QMouseEvent *m)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = QSinglePointEvent::position((QSinglePointEvent *)m);
  QVar1 = QPointF::toPoint(&local_38);
  QVar2 = QWidget::contentsRect((QWidget *)this);
  local_28 = (QPoint)((ulong)(uint)(QVar1.xp.m_i.m_i - QVar2.x1.m_i) |
                     (long)QVar1 - (QVar2._0_8_ & 0xffffffff00000000) & 0xffffffff00000000);
  if (*(int *)(m + 0x44) == 0) {
    m[0xc] = (QMouseEvent)0x0;
  }
  else {
    setCol(this,&local_28);
    newCol(this,this->hue,this->sat);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mouseMoveEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    if (m->buttons() == Qt::NoButton) {
        m->ignore();
        return;
    }
    setCol(p);
    emit newCol(hue, sat);
}